

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O2

void HTS_Label_clear(HTS_Label *label)

{
  _HTS_LabelString *p_Var1;
  HTS_LabelString *ptr;
  
  ptr = label->head;
  while (ptr != (HTS_LabelString *)0x0) {
    p_Var1 = ptr->next;
    HTS_free(ptr->name);
    HTS_free(ptr);
    ptr = p_Var1;
  }
  label->head = (HTS_LabelString *)0x0;
  label->size = 0;
  return;
}

Assistant:

void HTS_Label_clear(HTS_Label * label)
{
   HTS_LabelString *lstring, *next_lstring;

   for (lstring = label->head; lstring; lstring = next_lstring) {
      next_lstring = lstring->next;
      HTS_free(lstring->name);
      HTS_free(lstring);
   }
   HTS_Label_initialize(label);
}